

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::StripAllButComments::file
          (StripAllButComments *this,AST **body,Fodder *final_fodder)

{
  LiteralNull *pLVar1;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  LocationRange *in_stack_00000008;
  
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI);
  (**(code **)(*in_RDI + 8))(in_RDI,in_RDX);
  pLVar1 = Allocator::
           make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                     ((Allocator *)final_fodder,in_stack_00000008,unaff_retaddr);
  *in_RSI = pLVar1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         *)0x2bc68b);
  return;
}

Assistant:

virtual void file(AST *&body, Fodder &final_fodder)
    {
        expr(body);
        fodder(final_fodder);
        body = alloc.make<LiteralNull>(body->location, comments);
        final_fodder.clear();
    }